

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

PropertyBase *
Protocol::MQTT::V5::TypedProperty<(Protocol::MQTT::V5::PropertyType)17,_unsigned_int>::allocateProp
          (void)

{
  PropertyBase *pPVar1;
  
  pPVar1 = (PropertyBase *)operator_new(0x38);
  pPVar1->type = '\x11';
  pPVar1->next = (PropertyBase *)0x0;
  pPVar1->heapAllocated = true;
  pPVar1[1].super_Serializable._vptr_Serializable = (_func_int **)&pPVar1[1].type;
  (pPVar1->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_getSize_0011f828;
  *(undefined ***)&pPVar1[1].type = &PTR_typeSize_0011f898;
  *(undefined4 *)&pPVar1[1].next = 0;
  return pPVar1;
}

Assistant:

static PropertyBase * allocateProp() { return new Property<T>(type, T(), true) ; }